

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlGlyphClassDefn.cpp
# Opt level: O1

GdlGlyphClassMember * __thiscall
GdlGlyphClassDefn::AddGlyphToClass
          (GdlGlyphClassDefn *this,GrpLineAndFile *lnf,GlyphType glft,GdlGlyphDefn *pglfOutput)

{
  int iVar1;
  GdlGlyphClassMember *pglfd;
  
  pglfd = (GdlGlyphClassMember *)operator_new(0xb0);
  GdlObject::GdlObject(&(pglfd->super_GdlDefn).super_GdlObject);
  pglfd->m_fIsSpaceGlyph = -1;
  (pglfd->super_GdlDefn)._vptr_GdlDefn = (_func_int **)&PTR__GdlGlyphDefn_00241c30;
  *(GlyphType *)&pglfd->field_0x34 = glft;
  pglfd[1].super_GdlDefn._vptr_GdlDefn = (_func_int **)0x0;
  *(undefined2 *)&pglfd[1].super_GdlDefn.super_GdlObject.m_lnf.m_nLinePre = 0;
  pglfd[1].super_GdlDefn.super_GdlObject.m_lnf.m_nLineOrig = 0;
  pglfd[1].super_GdlDefn.super_GdlObject.m_lnf.m_staFile._M_dataplus._M_p = (pointer)pglfOutput;
  pglfd[1].super_GdlDefn.super_GdlObject.m_lnf.m_staFile._M_string_length =
       (size_type)((long)&pglfd[1].super_GdlDefn.super_GdlObject.m_lnf.m_staFile.field_2 + 8);
  pglfd[1].super_GdlDefn.super_GdlObject.m_lnf.m_staFile.field_2._M_allocated_capacity = 0;
  pglfd[1].super_GdlDefn.super_GdlObject.m_lnf.m_staFile.field_2._M_local_buf[8] = '\0';
  pglfd[2].super_GdlDefn._vptr_GdlDefn = (_func_int **)0x0;
  pglfd[2].super_GdlDefn.super_GdlObject.m_lnf.m_nLinePre = 0;
  pglfd[2].super_GdlDefn.super_GdlObject.m_lnf.m_nLineOrig = 0;
  pglfd[2].super_GdlDefn.super_GdlObject.m_lnf.m_staFile._M_dataplus._M_p = (pointer)0x0;
  pglfd[2].super_GdlDefn.super_GdlObject.m_lnf.m_staFile.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pglfd[2].super_GdlDefn.super_GdlObject.m_lnf.m_staFile.field_2 + 8) = 0;
  *(undefined8 *)((long)&pglfd[2].super_GdlDefn.super_GdlObject.m_lnf.m_staFile.field_2 + 9) = 0;
  *(undefined8 *)((long)&pglfd[2].m_fIsSpaceGlyph + 1) = 0;
  iVar1 = lnf->m_nLineOrig;
  (pglfd->super_GdlDefn).super_GdlObject.m_lnf.m_nLinePre = lnf->m_nLinePre;
  (pglfd->super_GdlDefn).super_GdlObject.m_lnf.m_nLineOrig = iVar1;
  std::__cxx11::string::_M_assign((string *)&(pglfd->super_GdlDefn).super_GdlObject.m_lnf.m_staFile)
  ;
  AddMember(this,pglfd,lnf);
  return pglfd;
}

Assistant:

GdlGlyphClassMember * GdlGlyphClassDefn::AddGlyphToClass(GrpLineAndFile const& lnf,
	GlyphType glft, GdlGlyphDefn * pglfOutput)
{
	GdlGlyphDefn * pglf = new GdlGlyphDefn(glft, pglfOutput);
	pglf->SetLineAndFile(lnf);
	AddMember(pglf, lnf);
	return pglf;
}